

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O0

char * kname(Proto *p,int index,char **name)

{
  TValue *kvalue;
  char **name_local;
  int index_local;
  Proto *p_local;
  
  if ((p->k[index].tt_ & 0xf) == 4) {
    *name = (char *)(p->k[index].value_.f + 0x18);
    p_local = (Proto *)anon_var_dwarf_38ed;
  }
  else {
    *name = "?";
    p_local = (Proto *)0x0;
  }
  return (char *)p_local;
}

Assistant:

static const char *kname (const Proto *p, int index, const char **name) {
  TValue *kvalue = &p->k[index];
  if (ttisstring(kvalue)) {
    *name = getstr(tsvalue(kvalue));
    return "constant";
  }
  else {
    *name = "?";
    return NULL;
  }
}